

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

bool __thiscall
pstore::json::details::number_matcher<json_out_callbacks>::do_frac_state
          (number_matcher<json_out_callbacks> *this,parser<json_out_callbacks> *parser,char c)

{
  error_code local_20;
  
  if (c == '.') {
    (this->super_matcher<json_out_callbacks>).state_ = 6;
  }
  else if ((c & 0xdfU) == 0x45) {
    (this->super_matcher<json_out_callbacks>).state_ = 8;
  }
  else {
    if (9 < (byte)(c - 0x30U)) {
      complete(this,parser);
      return false;
    }
    local_20._M_cat = get_error_category();
    local_20._M_value = 6;
    matcher<json_out_callbacks>::set_error
              (&this->super_matcher<json_out_callbacks>,parser,&local_20);
  }
  return true;
}

Assistant:

bool number_matcher<Callbacks>::do_frac_state (parser<Callbacks> & parser,
                                                           char const c) {
                bool match = true;
                if (c == '.') {
                    this->set_state (frac_initial_digit_state);
                } else if (c == 'e' || c == 'E') {
                    this->set_state (exponent_sign_state);
                } else if (c >= '0' && c <= '9') {
                    // digits are definitely not part of the next token so we can issue an error
                    // right here.
                    this->set_error (parser, error_code::number_out_of_range);
                } else {
                    // the 'frac' production is optional.
                    match = false;
                    this->complete (parser);
                }
                return match;
            }